

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxs.cpp
# Opt level: O2

PAL_ERROR AllocatePalThread(CPalThread **ppThread)

{
  PAL_ERROR PVar1;
  HANDLE local_28;
  HANDLE hThread;
  CPalThread *pThread;
  
  hThread = (HANDLE)0x0;
  PVar1 = CorUnix::CreateThreadData((CPalThread **)&hThread);
  if (PVar1 == 0) {
    PVar1 = CorUnix::CreateThreadObject((CPalThread *)hThread,(CPalThread *)hThread,&local_28);
    if (PVar1 == 0) {
      (**(code **)(*CorUnix::g_pObjectManager + 0x20))(CorUnix::g_pObjectManager,hThread,local_28);
      CorUnix::PROCAddThread((CPalThread *)hThread,(CPalThread *)hThread);
      PVar1 = 0;
    }
    else {
      pthread_setspecific(CorUnix::thObjKey,(void *)0x0);
      CorUnix::CPalThread::ReleaseThreadReference((CPalThread *)hThread);
    }
  }
  *ppThread = (CPalThread *)hThread;
  return PVar1;
}

Assistant:

PAL_ERROR
AllocatePalThread(CPalThread **ppThread)
{
    CPalThread *pThread = NULL;

    PAL_ERROR palError = CreateThreadData(&pThread);
    if (NO_ERROR != palError)
    {
        goto exit;
    }

    HANDLE hThread;
    palError = CreateThreadObject(pThread, pThread, &hThread);
    if (NO_ERROR != palError)
    {
        pthread_setspecific(thObjKey, NULL);
        pThread->ReleaseThreadReference();
        goto exit;
    }

    // Like CreateInitialProcessAndThreadObjects, we do not need this
    // thread handle, since we're not returning it to anyone who will
    // possibly release it.
    (void)g_pObjectManager->RevokeHandle(pThread, hThread);

    PROCAddThread(pThread, pThread);

exit:
    *ppThread = pThread;
    return palError;
}